

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

bool __thiscall Json::OurReader::readValue(OurReader *this)

{
  size_type sVar1;
  ulong uVar2;
  Value *pVVar3;
  long in_RDI;
  Value v_6;
  Value v_5;
  Value v_4;
  Value v_3;
  Value v_2;
  Value v_1;
  Value v;
  bool successful;
  Token token;
  undefined7 in_stack_fffffffffffffd58;
  undefined1 in_stack_fffffffffffffd5f;
  OurReader *in_stack_fffffffffffffd60;
  allocator *paVar4;
  String *in_stack_fffffffffffffd70;
  double in_stack_fffffffffffffd78;
  bool value;
  Value *in_stack_fffffffffffffd80;
  undefined8 in_stack_fffffffffffffd88;
  ValueType type;
  Value *in_stack_fffffffffffffd90;
  Location in_stack_fffffffffffffdb8;
  Token *in_stack_fffffffffffffdc0;
  OurReader *in_stack_fffffffffffffdc8;
  OurReader *in_stack_fffffffffffffdd0;
  Token *in_stack_fffffffffffffde0;
  OurReader *in_stack_fffffffffffffde8;
  allocator local_1c1;
  string local_1c0 [16];
  Token *in_stack_fffffffffffffe50;
  OurReader *in_stack_fffffffffffffe58;
  string local_88 [12];
  CommentPlacement in_stack_ffffffffffffff84;
  String *in_stack_ffffffffffffff88;
  Value *in_stack_ffffffffffffff90;
  bool local_61;
  undefined4 local_60;
  long local_58;
  long local_50;
  Token *in_stack_ffffffffffffffc0;
  OurReader *in_stack_ffffffffffffffc8;
  string local_30 [47];
  byte local_1;
  
  type = (ValueType)((ulong)in_stack_fffffffffffffd88 >> 0x20);
  sVar1 = std::stack<Json::Value_*,_std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>_>::
          size((stack<Json::Value_*,_std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>_> *)
               0x1eb354);
  if (*(ulong *)(in_RDI + 0x110) < sVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_30,"Exceeded stackLimit in readValue().",(allocator *)&stack0xffffffffffffffcf)
    ;
    throwRuntimeError(in_stack_fffffffffffffd70);
  }
  skipCommentTokens(in_stack_fffffffffffffd60,
                    (Token *)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58));
  local_61 = true;
  if (((*(byte *)(in_RDI + 0x118) & 1) != 0) &&
     (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) == 0)) {
    currentValue((OurReader *)0x1eb44f);
    std::__cxx11::string::string(local_88,(string *)(in_RDI + 0xe8));
    Value::setComment(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff84)
    ;
    std::__cxx11::string::~string(local_88);
    std::__cxx11::string::clear();
  }
  value = SUB81((ulong)in_stack_fffffffffffffd78 >> 0x38,0);
  switch(local_60) {
  case 1:
    local_61 = readObject(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    pVVar3 = currentValue((OurReader *)0x1eb53c);
    Value::setOffsetLimit(pVVar3,*(long *)(in_RDI + 0xd0) - *(long *)(in_RDI + 0xc0));
    break;
  case 2:
  case 4:
  case 0xd:
    if ((*(byte *)(in_RDI + 0x10a) & 1) == 0) goto switchD_001eb50f_default;
    *(long *)(in_RDI + 0xd0) = *(long *)(in_RDI + 0xd0) + -1;
    Value::Value(in_stack_fffffffffffffd90,type);
    currentValue((OurReader *)0x1ebbd6);
    Value::swapPayload((Value *)in_stack_fffffffffffffd60,
                       (Value *)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58));
    pVVar3 = currentValue((OurReader *)0x1ebbfe);
    Value::setOffsetStart(pVVar3,~*(ulong *)(in_RDI + 0xc0) + *(long *)(in_RDI + 0xd0));
    pVVar3 = currentValue((OurReader *)0x1ebc3a);
    Value::setOffsetLimit(pVVar3,*(long *)(in_RDI + 0xd0) - *(long *)(in_RDI + 0xc0));
    Value::~Value((Value *)in_stack_fffffffffffffd60);
    break;
  case 3:
    local_61 = readArray(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
    pVVar3 = currentValue((OurReader *)0x1eb58d);
    Value::setOffsetLimit(pVVar3,*(long *)(in_RDI + 0xd0) - *(long *)(in_RDI + 0xc0));
    break;
  case 5:
    local_61 = decodeString(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
    break;
  case 6:
    local_61 = decodeNumber(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
    break;
  case 7:
    Value::Value(in_stack_fffffffffffffd80,value);
    currentValue((OurReader *)0x1eb618);
    Value::swapPayload((Value *)in_stack_fffffffffffffd60,
                       (Value *)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58));
    pVVar3 = currentValue((OurReader *)0x1eb646);
    Value::setOffsetStart(pVVar3,local_58 - *(long *)(in_RDI + 0xc0));
    pVVar3 = currentValue((OurReader *)0x1eb686);
    Value::setOffsetLimit(pVVar3,local_50 - *(long *)(in_RDI + 0xc0));
    Value::~Value((Value *)in_stack_fffffffffffffd60);
    break;
  case 8:
    Value::Value(in_stack_fffffffffffffd80,value);
    currentValue((OurReader *)0x1eb70d);
    Value::swapPayload((Value *)in_stack_fffffffffffffd60,
                       (Value *)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58));
    pVVar3 = currentValue((OurReader *)0x1eb73b);
    Value::setOffsetStart(pVVar3,local_58 - *(long *)(in_RDI + 0xc0));
    pVVar3 = currentValue((OurReader *)0x1eb77b);
    Value::setOffsetLimit(pVVar3,local_50 - *(long *)(in_RDI + 0xc0));
    Value::~Value((Value *)in_stack_fffffffffffffd60);
    break;
  case 9:
    Value::Value(in_stack_fffffffffffffd90,type);
    currentValue((OurReader *)0x1eb802);
    Value::swapPayload((Value *)in_stack_fffffffffffffd60,
                       (Value *)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58));
    pVVar3 = currentValue((OurReader *)0x1eb830);
    Value::setOffsetStart(pVVar3,local_58 - *(long *)(in_RDI + 0xc0));
    pVVar3 = currentValue((OurReader *)0x1eb86a);
    Value::setOffsetLimit(pVVar3,local_50 - *(long *)(in_RDI + 0xc0));
    Value::~Value((Value *)in_stack_fffffffffffffd60);
    break;
  case 10:
    std::numeric_limits<double>::quiet_NaN();
    Value::Value(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
    currentValue((OurReader *)0x1eb8ee);
    Value::swapPayload((Value *)in_stack_fffffffffffffd60,
                       (Value *)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58));
    pVVar3 = currentValue((OurReader *)0x1eb916);
    Value::setOffsetStart(pVVar3,local_58 - *(long *)(in_RDI + 0xc0));
    pVVar3 = currentValue((OurReader *)0x1eb950);
    Value::setOffsetLimit(pVVar3,local_50 - *(long *)(in_RDI + 0xc0));
    Value::~Value((Value *)in_stack_fffffffffffffd60);
    break;
  case 0xb:
    std::numeric_limits<double>::infinity();
    Value::Value(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
    currentValue((OurReader *)0x1eb9d4);
    Value::swapPayload((Value *)in_stack_fffffffffffffd60,
                       (Value *)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58));
    pVVar3 = currentValue((OurReader *)0x1eb9fc);
    Value::setOffsetStart(pVVar3,local_58 - *(long *)(in_RDI + 0xc0));
    pVVar3 = currentValue((OurReader *)0x1eba36);
    Value::setOffsetLimit(pVVar3,local_50 - *(long *)(in_RDI + 0xc0));
    Value::~Value((Value *)in_stack_fffffffffffffd60);
    break;
  case 0xc:
    std::numeric_limits<double>::infinity();
    Value::Value(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
    currentValue((OurReader *)0x1ebac5);
    Value::swapPayload((Value *)in_stack_fffffffffffffd60,
                       (Value *)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58));
    pVVar3 = currentValue((OurReader *)0x1ebaed);
    Value::setOffsetStart(pVVar3,local_58 - *(long *)(in_RDI + 0xc0));
    pVVar3 = currentValue((OurReader *)0x1ebb27);
    Value::setOffsetLimit(pVVar3,local_50 - *(long *)(in_RDI + 0xc0));
    Value::~Value((Value *)in_stack_fffffffffffffd60);
    break;
  default:
switchD_001eb50f_default:
    pVVar3 = currentValue((OurReader *)0x1ebcad);
    Value::setOffsetStart(pVVar3,local_58 - *(long *)(in_RDI + 0xc0));
    pVVar3 = currentValue((OurReader *)0x1ebcdc);
    Value::setOffsetLimit(pVVar3,local_50 - *(long *)(in_RDI + 0xc0));
    paVar4 = &local_1c1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1c0,"Syntax error: value, object or array expected.",paVar4);
    local_1 = addError(in_stack_fffffffffffffdd0,(String *)in_stack_fffffffffffffdc8,
                       in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    std::__cxx11::string::~string(local_1c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
    goto LAB_001ebe12;
  }
  if ((*(byte *)(in_RDI + 0x118) & 1) != 0) {
    *(undefined8 *)(in_RDI + 0xd8) = *(undefined8 *)(in_RDI + 0xd0);
    pVVar3 = currentValue((OurReader *)0x1ebdf0);
    *(Value **)(in_RDI + 0xe0) = pVVar3;
  }
  local_1 = local_61;
LAB_001ebe12:
  return (bool)(local_1 & 1);
}

Assistant:

bool OurReader::readValue() {
  //  To preserve the old behaviour we cast size_t to int.
  if (nodes_.size() > features_.stackLimit_)
    throwRuntimeError("Exceeded stackLimit in readValue().");
  Token token;
  skipCommentTokens(token);
  bool successful = true;

  if (collectComments_ && !commentsBefore_.empty()) {
    currentValue().setComment(commentsBefore_, commentBefore);
    commentsBefore_.clear();
  }

  switch (token.type_) {
  case tokenObjectBegin:
    successful = readObject(token);
    currentValue().setOffsetLimit(current_ - begin_);
    break;
  case tokenArrayBegin:
    successful = readArray(token);
    currentValue().setOffsetLimit(current_ - begin_);
    break;
  case tokenNumber:
    successful = decodeNumber(token);
    break;
  case tokenString:
    successful = decodeString(token);
    break;
  case tokenTrue: {
    Value v(true);
    currentValue().swapPayload(v);
    currentValue().setOffsetStart(token.start_ - begin_);
    currentValue().setOffsetLimit(token.end_ - begin_);
  } break;
  case tokenFalse: {
    Value v(false);
    currentValue().swapPayload(v);
    currentValue().setOffsetStart(token.start_ - begin_);
    currentValue().setOffsetLimit(token.end_ - begin_);
  } break;
  case tokenNull: {
    Value v;
    currentValue().swapPayload(v);
    currentValue().setOffsetStart(token.start_ - begin_);
    currentValue().setOffsetLimit(token.end_ - begin_);
  } break;
  case tokenNaN: {
    Value v(std::numeric_limits<double>::quiet_NaN());
    currentValue().swapPayload(v);
    currentValue().setOffsetStart(token.start_ - begin_);
    currentValue().setOffsetLimit(token.end_ - begin_);
  } break;
  case tokenPosInf: {
    Value v(std::numeric_limits<double>::infinity());
    currentValue().swapPayload(v);
    currentValue().setOffsetStart(token.start_ - begin_);
    currentValue().setOffsetLimit(token.end_ - begin_);
  } break;
  case tokenNegInf: {
    Value v(-std::numeric_limits<double>::infinity());
    currentValue().swapPayload(v);
    currentValue().setOffsetStart(token.start_ - begin_);
    currentValue().setOffsetLimit(token.end_ - begin_);
  } break;
  case tokenArraySeparator:
  case tokenObjectEnd:
  case tokenArrayEnd:
    if (features_.allowDroppedNullPlaceholders_) {
      // "Un-read" the current token and mark the current value as a null
      // token.
      current_--;
      Value v;
      currentValue().swapPayload(v);
      currentValue().setOffsetStart(current_ - begin_ - 1);
      currentValue().setOffsetLimit(current_ - begin_);
      break;
    } // else, fall through ...
  default:
    currentValue().setOffsetStart(token.start_ - begin_);
    currentValue().setOffsetLimit(token.end_ - begin_);
    return addError("Syntax error: value, object or array expected.", token);
  }

  if (collectComments_) {
    lastValueEnd_ = current_;
    lastValue_ = &currentValue();
  }

  return successful;
}